

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_helper.c
# Opt level: O2

void helper_idte(CPUS390XState_conflict *env,uint64_t r1,uint64_t r2,uint32_t m4)

{
  uint64_t uVar1;
  abi_ptr addr;
  ushort uVar2;
  uint uVar3;
  uintptr_t unaff_retaddr;
  
  if ((r2 & 0xff000) != 0) {
    tcg_s390_program_interrupt_s390x(env,6,unaff_retaddr);
  }
  if (((uint)r2 >> 0xb & 1) != 0) goto LAB_00ae3380;
  uVar3 = (uint)(r2 >> 0x20);
  switch((uint)(r1 >> 2) & 3) {
  case 0:
    uVar3 = (uint)(r2 >> 0x14) & 0xfff;
    break;
  case 1:
    uVar3 = (uint)(r2 >> 0x1f);
    break;
  case 2:
    uVar3 = uVar3 >> 10;
    break;
  case 3:
    uVar3 = uVar3 >> 0x15;
    goto LAB_00ae3326;
  }
  uVar3 = uVar3 & 0x7ff;
LAB_00ae3326:
  uVar3 = uVar3 << 3;
  for (uVar2 = 0; uVar2 <= (ushort)r2; uVar2 = uVar2 + 1) {
    addr = (ulong)(uVar3 & 0x3ff8) + (r1 & 0xfffffffffffff000);
    uVar1 = cpu_ldq_mmuidx_ra_s390x(env,addr,3,unaff_retaddr);
    if ((uVar1 & 0x20) == 0) {
      cpu_stq_mmuidx_ra_s390x(env,addr,uVar1 | 0x20,3,unaff_retaddr);
    }
    uVar3 = uVar3 + 8;
  }
LAB_00ae3380:
  if ((m4 & 1) == 0) {
    tlb_flush_all_cpus_synced_s390x((CPUState *)(env[-0x1e].vregs + 0xf));
    return;
  }
  tlb_flush_s390x((CPUState *)(env[-0x1e].vregs + 0xf));
  return;
}

Assistant:

void HELPER(idte)(CPUS390XState *env, uint64_t r1, uint64_t r2, uint32_t m4)
{
    CPUState *cs = env_cpu(env);
    const uintptr_t ra = GETPC();
    uint64_t table, entry, raddr;
    uint16_t entries, i, index = 0;

    if (r2 & 0xff000) {
        tcg_s390_program_interrupt(env, PGM_SPECIFICATION, ra);
    }

    if (!(r2 & 0x800)) {
        /* invalidation-and-clearing operation */
        table = r1 & ASCE_ORIGIN;
        entries = (r2 & 0x7ff) + 1;

        switch (r1 & ASCE_TYPE_MASK) {
        case ASCE_TYPE_REGION1:
            index = (r2 >> 53) & 0x7ff;
            break;
        case ASCE_TYPE_REGION2:
            index = (r2 >> 42) & 0x7ff;
            break;
        case ASCE_TYPE_REGION3:
            index = (r2 >> 31) & 0x7ff;
            break;
        case ASCE_TYPE_SEGMENT:
            index = (r2 >> 20) & 0x7ff;
            break;
        }
        for (i = 0; i < entries; i++) {
            /* addresses are not wrapped in 24/31bit mode but table index is */
            raddr = table + ((index + i) & 0x7ff) * sizeof(entry);
            entry = cpu_ldq_mmuidx_ra(env, raddr, MMU_REAL_IDX, ra);
            if (!(entry & REGION_ENTRY_I)) {
                /* we are allowed to not store if already invalid */
                entry |= REGION_ENTRY_I;
                cpu_stq_mmuidx_ra(env, raddr, entry, MMU_REAL_IDX, ra);
            }
        }
    }

    /* We simply flush the complete tlb, therefore we can ignore r3. */
    if (m4 & 1) {
        tlb_flush(cs);
    } else {
        tlb_flush_all_cpus_synced(cs);
    }
}